

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O0

int dbgu_find_src(char *origname,int origlen,char *fullname,size_t full_len,int must_find_file)

{
  int must_find_file_local;
  size_t full_len_local;
  char *fullname_local;
  int origlen_local;
  char *origname_local;
  
  return 0;
}

Assistant:

int dbgu_find_src(const char *origname, int origlen,
                  char *fullname, size_t full_len, int must_find_file)
{
    VARUSED(origname);
    VARUSED(origlen);
    VARUSED(fullname);
    VARUSED(full_len);
    VARUSED(must_find_file);

    /* indicate failure */
    return FALSE;
}